

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

tuple<int,_libtorrent::span<libtorrent::span<const_char>_>_> * __thiscall
libtorrent::bt_peer_connection::hit_send_barrier
          (tuple<int,_libtorrent::span<libtorrent::span<const_char>_>_> *__return_storage_ptr__,
          bt_peer_connection *this,span<libtorrent::span<char>_> iovec)

{
  tuple<int&,libtorrent::span<libtorrent::span<char_const>>&> local_78 [16];
  int local_68 [4];
  undefined1 local_58 [32];
  span<libtorrent::span<const_char>_> out_iovec;
  int next_barrier;
  bt_peer_connection *this_local;
  span<libtorrent::span<char>_> iovec_local;
  
  iovec_local.m_ptr = (span<char> *)iovec.m_len;
  this_local = (bt_peer_connection *)iovec.m_ptr;
  iovec_local.m_len = (difference_type)__return_storage_ptr__;
  span<libtorrent::span<const_char>_>::span
            ((span<libtorrent::span<const_char>_> *)(local_58 + 0x18));
  span<libtorrent::span<char>>::
  span<libtorrent::span<libtorrent::span<char>>,libtorrent::span<char>,void>
            ((span<libtorrent::span<char>> *)local_68,(span<libtorrent::span<char>_> *)&this_local);
  encryption_handler::encrypt
            ((encryption_handler *)local_58,(char *)&this->m_enc_handler,local_68[0]);
  std::tie<int,libtorrent::span<libtorrent::span<char_const>>>
            ((int *)local_78,(span<libtorrent::span<const_char>_> *)((long)&out_iovec.m_len + 4));
  std::tuple<int&,libtorrent::span<libtorrent::span<char_const>>&>::operator=
            (local_78,(tuple<int,_libtorrent::span<libtorrent::span<const_char>_>_> *)local_58);
  if (out_iovec.m_len._4_4_ != 0) {
    peer_connection::peer_log
              (&this->super_peer_connection,outgoing,"SEND_BARRIER","encrypted block s = %d",
               (ulong)out_iovec.m_len._4_4_);
  }
  std::make_tuple<int&,libtorrent::span<libtorrent::span<char_const>>&>
            (__return_storage_ptr__,(int *)((long)&out_iovec.m_len + 4),
             (span<libtorrent::span<const_char>_> *)(local_58 + 0x18));
  return __return_storage_ptr__;
}

Assistant:

std::tuple<int, span<span<char const>>>
	bt_peer_connection::hit_send_barrier(
		span<span<char>> iovec)
	{
		int next_barrier;
		span<span<char const>> out_iovec;
		std::tie(next_barrier, out_iovec) = m_enc_handler.encrypt(iovec);
#ifndef TORRENT_DISABLE_LOGGING
		if (next_barrier != 0)
			peer_log(peer_log_alert::outgoing, "SEND_BARRIER"
				, "encrypted block s = %d", next_barrier);
#endif
		return std::make_tuple(next_barrier, out_iovec);
	}